

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * ExtractFilenameWithoutExt(string *__return_storage_ptr__,string *path)

{
  string local_70 [32];
  long local_50;
  size_t filename_start;
  size_t filename_len;
  char *local_38;
  char *end;
  char *start;
  char *cpath;
  size_t len;
  string *path_local;
  string *filename;
  
  len = (size_t)path;
  path_local = __return_storage_ptr__;
  cpath = (char *)std::__cxx11::string::length();
  start = (char *)std::__cxx11::string::c_str();
  end = strrchr(start,0x2f);
  local_38 = strrchr(start,0x2e);
  if (local_38 == (char *)0x0) {
    local_38 = start + (long)cpath;
  }
  if (end == (char *)0x0) {
    end = start;
  }
  else {
    end = end + 1;
  }
  filename_len._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  filename_start = (long)local_38 - (long)end;
  local_50 = (long)end - (long)start;
  std::__cxx11::string::substr((ulong)local_70,len);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_70);
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractFilenameWithoutExt(const std::string& path) {
    size_t len = path.length();
    const char* cpath = path.c_str();
    const char* start = strrchr(cpath, PATH_DELIMITER);
    const char* end = strrchr(cpath, '.');

    if (end == nullptr) {
        end = &cpath[len];
    }
    if (start == nullptr) {
        start = &cpath[0];
    } else {
        start = start + 1;
    }

    std::string filename;
    size_t filename_len = end - start;
    size_t filename_start = start - cpath;
    filename = path.substr(filename_start, filename_len);

    return filename;
}